

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O3

void __thiscall
tsbp::TwoStepBranchingProcedure::DomainReductionX
          (TwoStepBranchingProcedure *this,size_t domainReducedItemIndex)

{
  pointer __s;
  pointer puVar1;
  bool bVar2;
  reference pvVar3;
  undefined8 *puVar4;
  size_t j;
  pointer pRVar5;
  size_type pos;
  size_t sVar6;
  double dVar7;
  logic_error ex;
  allocator<unsigned_long> local_61;
  vector<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::allocator<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>
  *local_60;
  size_t local_58;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  
  local_60 = (vector<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::allocator<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>
              *)&this->itemSpecificPlacementPointsX;
  local_58 = domainReducedItemIndex;
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::reserve((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)local_60,
            (long)(this->items).
                  super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->items).
                  super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>._M_impl.
                  super__Vector_impl_data._M_start >> 5);
  pRVar5 = (this->items).super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->items).super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>._M_impl.
      super__Vector_impl_data._M_finish != pRVar5) {
    dVar7 = floor((double)((this->container).super_Rectangle.Dx - pRVar5[local_58].Dx) * 0.5);
    sVar6 = 0;
    do {
      if (sVar6 != (long)pRVar5[sVar6].InternId) {
        std::logic_error::logic_error((logic_error *)&local_50,"Item IDs do not match in TSBP.");
        puVar4 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar4 = &__cxxabiv1::__pointer_type_info::vtable;
        __cxa_throw(puVar4,&std::exception::typeinfo,std::exception::~exception);
      }
      if (sVar6 == local_58) {
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                  (&local_50,(long)(this->container).super_Rectangle.Dx,0,&local_61);
        pvVar3 = std::
                 vector<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::allocator<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>
                 ::emplace_back<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>
                           (local_60,&local_50);
        bVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                m_check_invariants(&local_50);
        if (!bVar2) {
LAB_00149690:
          __assert_fail("m_check_invariants()",
                        "/usr/include/boost/dynamic_bitset/dynamic_bitset.hpp",0x2be,
                        "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                       );
        }
        if (local_50.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_50.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_50.m_bits.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_50.m_bits.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        __s = (pvVar3->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
        puVar1 = (pvVar3->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (__s != puVar1) {
          memset(__s,0,(long)puVar1 - (long)__s & 0xfffffffffffffff8);
        }
        pos = 0;
        do {
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set(pvVar3,pos,true)
          ;
          pos = pos + 1;
        } while (pos <= (ulong)(long)(int)dVar7);
        this->reducedItemDomainX = (long)(int)dVar7;
      }
      else {
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                  (&local_50,(long)(this->container).super_Rectangle.Dx,0,&local_61);
        pvVar3 = std::
                 vector<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::allocator<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>
                 ::emplace_back<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>
                           (local_60,&local_50);
        bVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                m_check_invariants(&local_50);
        if (!bVar2) goto LAB_00149690;
        if (local_50.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_50.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_50.m_bits.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_50.m_bits.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set(pvVar3);
      }
      sVar6 = sVar6 + 1;
      pRVar5 = (this->items).super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (sVar6 < (ulong)((long)(this->items).
                                   super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar5 >> 5));
  }
  return;
}

Assistant:

void TwoStepBranchingProcedure::DomainReductionX(size_t domainReducedItemIndex)
{
    itemSpecificPlacementPointsX.reserve(this->items.size());

    int reducedDomainThreshold = std::floor((this->container.Dx - this->items[domainReducedItemIndex].Dx) / 2.0);

    for (size_t i = 0; i < this->items.size(); i++)
    {
        const Rectangle& item = this->items[i];
        if (item.InternId != i)
        {
            auto ex = std::logic_error("Item IDs do not match in TSBP.");
            throw std::exception(ex);
        }

        if (i == domainReducedItemIndex)
        {
            auto& bitsetX = this->itemSpecificPlacementPointsX.emplace_back(boost::dynamic_bitset<>(this->container.Dx));
            bitsetX.reset();

            for (size_t j = 0; j <= reducedDomainThreshold; j++)
            {
                bitsetX.set(j);
            }

            this->reducedItemDomainX = reducedDomainThreshold;

            continue;
        }

        // TODO: reduce by item.Dy to exclude overlap with the container. Enables simplification of no-overlap checks.
        auto& bitsetX = this->itemSpecificPlacementPointsX.emplace_back(boost::dynamic_bitset<>(this->container.Dx));
        bitsetX.set();
    }
}